

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

MauResult __thiscall
mau::ProxySession::Initialize
          (ProxySession *this,char *serverHostname,uint16_t serverPort,MauProxyConfig *proxyConfig,
          MauChannelConfig *channelConfig)

{
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  *this_00;
  BufferAllocator *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mutex *__mutex_00;
  ostringstream *this_01;
  uint __val;
  uint32_t uVar2;
  char *pcVar3;
  impl_type *piVar4;
  element_type *peVar5;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar6;
  basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>> *this_02;
  MauAppContextPtr pvVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  size_type sVar12;
  char cVar13;
  char cVar14;
  bool bVar15;
  int iVar16;
  ostream *poVar17;
  io_context *piVar18;
  _Alloc_hider _Var19;
  pointer __p;
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *pwVar20;
  pointer __p_00;
  datagram_socket_service<asio::ip::udp> *pdVar21;
  basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  OutputWorker *this_04;
  thread *this_05;
  uint8_t *readBuffer;
  string *handler;
  uint uVar23;
  MauResult MVar24;
  string __str;
  error_code error;
  UDPAddress bindAddress;
  ostringstream oss;
  string local_228;
  allocator local_1f9;
  string local_1f8;
  sockaddr local_1d4;
  undefined8 uStack_1c4;
  undefined4 local_1bc;
  undefined1 local_1b8 [112];
  ios_base local_148 [16];
  ios_base local_138 [264];
  
  handler = &local_228;
  (this->super_DeliveryCommonData).ProxyConfig.SendHook = proxyConfig->SendHook;
  uVar2 = proxyConfig->UDPSendBufferSizeBytes;
  uVar8 = proxyConfig->UDPRecvBufferSizeBytes;
  uVar9 = proxyConfig->UDPListenPort;
  uVar10 = proxyConfig->MaxDatagramBytes;
  uVar11 = *(undefined4 *)&proxyConfig->field_0x14;
  pvVar7 = proxyConfig->SendHookContext;
  (this->super_DeliveryCommonData).ProxyConfig.Version = proxyConfig->Version;
  (this->super_DeliveryCommonData).ProxyConfig.UDPSendBufferSizeBytes = uVar2;
  (this->super_DeliveryCommonData).ProxyConfig.UDPRecvBufferSizeBytes = uVar8;
  (this->super_DeliveryCommonData).ProxyConfig.UDPListenPort = uVar9;
  (this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes = uVar10;
  *(undefined4 *)&(this->super_DeliveryCommonData).ProxyConfig.field_0x14 = uVar11;
  (this->super_DeliveryCommonData).ProxyConfig.SendHookContext = pvVar7;
  LockedValue<MauChannelConfig_t>::Set
            (&(this->super_DeliveryCommonData).ChannelConfig,channelConfig);
  pcVar3 = (char *)(this->ServerHostname)._M_string_length;
  strlen(serverHostname);
  std::__cxx11::string::_M_replace((ulong)&this->ServerHostname,0,pcVar3,(ulong)serverHostname);
  this->ServerPort = serverPort;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[Port ",6);
  __val = proxyConfig->UDPListenPort;
  cVar14 = '\x01';
  if (9 < __val) {
    uVar23 = __val;
    cVar13 = '\x04';
    do {
      cVar14 = cVar13;
      if (uVar23 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0010ee21;
      }
      if (uVar23 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0010ee21;
      }
      if (uVar23 < 10000) goto LAB_0010ee21;
      bVar15 = 99999 < uVar23;
      uVar23 = uVar23 / 10000;
      cVar13 = cVar14 + '\x04';
    } while (bVar15);
    cVar14 = cVar14 + '\x01';
  }
LAB_0010ee21:
  paVar1 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_228,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_228._M_dataplus._M_p,(uint)local_228._M_string_length,__val);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  logger::Channel::SetPrefix((Channel *)this,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  piVar18 = (io_context *)operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (piVar18 != (io_context *)0x0) {
    asio::io_context::io_context(piVar18);
  }
  local_228._M_dataplus._M_p = (pointer)piVar18;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<asio::io_context*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length,piVar18);
  sVar12 = local_228._M_string_length;
  _Var19._M_p = local_228._M_dataplus._M_p;
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  p_Var22 = (this->super_DeliveryCommonData).Context.
            super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_DeliveryCommonData).Context.
  super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var19._M_p;
  (this->super_DeliveryCommonData).Context.
  super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar12;
  if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length);
    }
    _Var19._M_p = (pointer)(this->super_DeliveryCommonData).Context.
                           super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  MVar24 = Mau_OOM;
  if ((io_context *)_Var19._M_p != (io_context *)0x0) {
    piVar4 = ((io_context *)_Var19._M_p)->impl_;
    __mutex_00 = &piVar4->mutex_;
    pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
    piVar4->stopped_ = false;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    peVar5 = (this->super_DeliveryCommonData).Context.
             super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __p = (pointer)operator_new(0x40,(nothrow_t *)&std::nothrow);
    if (__p != (pointer)0x0) {
      local_228._M_dataplus._M_p =
           (pointer)&asio::detail::
                     typeid_wrapper<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                     ::typeinfo;
      local_228._M_string_length = 0;
      pwVar20 = (waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                 *)asio::detail::service_registry::do_use_service
                             ((peVar5->super_execution_context).service_registry_,(key *)&local_228,
                              asio::detail::service_registry::
                              create<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>,asio::io_context>
                              ,peVar5);
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).service_ = pwVar20;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.op_queue_.front_ = (wait_op *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.op_queue_.back_ = (wait_op *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.heap_index_ = 0xffffffffffffffff;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.next_ = (per_timer_data *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.prev_ = (per_timer_data *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.expiry.__d.__r = 0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.might_have_pending_waits = false;
    }
    std::
    __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
             *)&this->Ticker,__p);
    peVar5 = (this->super_DeliveryCommonData).Context.
             super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __p_00 = (pointer)operator_new(0x20,(nothrow_t *)&std::nothrow);
    if (__p_00 != (pointer)0x0) {
      local_228._M_dataplus._M_p =
           (pointer)&asio::detail::typeid_wrapper<asio::datagram_socket_service<asio::ip::udp>>::
                     typeinfo;
      local_228._M_string_length = 0;
      pdVar21 = (datagram_socket_service<asio::ip::udp> *)
                asio::detail::service_registry::do_use_service
                          ((peVar5->super_execution_context).service_registry_,(key *)&local_228,
                           asio::detail::service_registry::
                           create<asio::datagram_socket_service<asio::ip::udp>,asio::io_context>,
                           peVar5);
      (__p_00->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
      super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_ = pdVar21;
      (__p_00->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
      super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
      protocol_.family_ = 2;
      (__p_00->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
      super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
      super_base_implementation_type.socket_ = -1;
      (__p_00->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
      super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
      super_base_implementation_type.state_ = '\0';
    }
    this_00 = &(this->super_DeliveryCommonData).Socket;
    std::
    __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             *)this_00,__p_00);
    piVar18 = (this->super_DeliveryCommonData).Context.
              super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_03 = (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)
              operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (this_03 != (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)0x0) {
      asio::basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>::basic_io_object
                (this_03,piVar18);
    }
    std::
    __uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)&this->Resolver,(pointer)this_03);
    if ((((this->super_DeliveryCommonData).Socket._M_t.
          super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
          .
          super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
          ._M_head_impl !=
          (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)0x0
         ) && ((this->Resolver)._M_t.
               super___uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
               .
               super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
               ._M_head_impl !=
               (basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *)0x0)) &&
       ((this->Ticker)._M_t.
        super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
        .
        super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
        ._M_head_impl !=
        (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
         *)0x0)) {
      postNextTimer(this);
      bVar15 = DeliveryChannel::Initialize(&this->S2C,&this->super_DeliveryCommonData);
      if (bVar15) {
        bVar15 = DeliveryChannel::Initialize(&this->C2S,&this->super_DeliveryCommonData);
        if (bVar15) {
          local_1bc = 0;
          local_1d4.sa_data[6] = '\0';
          local_1d4.sa_data[7] = '\0';
          local_1d4.sa_data[8] = '\0';
          local_1d4.sa_data[9] = '\0';
          local_1d4.sa_data[10] = '\0';
          local_1d4.sa_data[0xb] = '\0';
          local_1d4.sa_data[0xc] = '\0';
          local_1d4.sa_data[0xd] = '\0';
          uStack_1c4 = 0;
          local_1d4.sa_family = 2;
          local_1f8.field_2._M_allocated_capacity._0_4_ = 0;
          local_1d4.sa_data._0_2_ =
               swap_bytes((short)(this->super_DeliveryCommonData).ProxyConfig.UDPListenPort);
          local_1d4.sa_data[2] = '\0';
          local_1d4.sa_data[3] = '\0';
          local_1d4.sa_data[4] = '\0';
          local_1d4.sa_data[5] = '\0';
          p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::_V2::system_category();
          pbVar6 = (this->super_DeliveryCommonData).Socket._M_t.
                   super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   .
                   super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                   ._M_head_impl;
          local_228._M_dataplus._M_p._0_4_ = 2;
          local_1f8.field_2._8_8_ = p_Var22;
          asio::detail::reactive_socket_service<asio::ip::udp>::open
                    ((reactive_socket_service<asio::ip::udp> *)
                     (*(long *)&(pbVar6->
                                super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                ).
                                super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                     + 0x28),(char *)((long)&(pbVar6->
                                             super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                             ).
                                             super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                                     + 8),(int)&local_228,&local_1f8.field_2);
          MVar24 = Mau_NetworkFailed;
          if (local_1f8.field_2._M_allocated_capacity._0_4_ == 0) {
            pbVar6 = (this_00->_M_t).
                     super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                     .
                     super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                     ._M_head_impl;
            asio::detail::reactive_socket_service<asio::ip::udp>::bind
                      ((reactive_socket_service<asio::ip::udp> *)
                       (*(long *)&(pbVar6->
                                  super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                  ).
                                  super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                       + 0x28),(int)pbVar6 + 8,&local_1d4,(int)&local_1f8 + 0x10);
            MVar24 = Mau_PortInUse;
            if (local_1f8.field_2._M_allocated_capacity._0_4_ == 0) {
              local_1f8._M_string_length._4_4_ =
                   (this->super_DeliveryCommonData).ProxyConfig.UDPRecvBufferSizeBytes;
              local_228._M_dataplus._M_p = local_228._M_dataplus._M_p & 0xffffffff00000000;
              pbVar6 = (this->super_DeliveryCommonData).Socket._M_t.
                       super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                       .
                       super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                       ._M_head_impl;
              local_1f8._M_dataplus._M_p._0_4_ =
                   (this->super_DeliveryCommonData).ProxyConfig.UDPSendBufferSizeBytes;
              local_228._M_string_length = (size_type)p_Var22;
              asio::detail::reactive_socket_service<asio::ip::udp>::
              set_option<asio::detail::socket_option::integer<1,7>>
                        ((reactive_socket_service<asio::ip::udp> *)
                         (*(long *)&(pbVar6->
                                    super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                    ).
                                    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                         + 0x28),(implementation_type *)
                                 ((long)&(pbVar6->
                                         super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                         ).
                                         super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                                 + 8),(integer<1,_7> *)&local_1f8,(error_code *)&local_228);
              if ((int)local_228._M_dataplus._M_p == 0) {
                pbVar6 = (this_00->_M_t).
                         super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                         .
                         super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                         ._M_head_impl;
                local_1f8._M_dataplus._M_p._0_4_ = local_1f8._M_string_length._4_4_;
                asio::detail::reactive_socket_service<asio::ip::udp>::
                set_option<asio::detail::socket_option::integer<1,8>>
                          ((reactive_socket_service<asio::ip::udp> *)
                           (*(long *)&(pbVar6->
                                      super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                      ).
                                      super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                           + 0x28),(implementation_type *)
                                   ((long)&(pbVar6->
                                           super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                           ).
                                           super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                                   + 8),(integer<1,_8> *)&local_1f8,(error_code *)&local_228);
                if ((int)local_228._M_dataplus._M_p == 0) {
                  pbVar6 = (this_00->_M_t).
                           super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                           .
                           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                           ._M_head_impl;
                  local_1f8._M_dataplus._M_p._0_4_ = 1;
                  asio::detail::reactive_socket_service<asio::ip::udp>::
                  set_option<asio::detail::socket_option::boolean<1,2>>
                            ((reactive_socket_service<asio::ip::udp> *)
                             (*(long *)&(pbVar6->
                                        super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                        ).
                                        super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                             + 0x28),(implementation_type *)
                                     ((long)&(pbVar6->
                                             super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                             ).
                                             super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                                     + 8),(boolean<1,_2> *)&local_1f8,(error_code *)&local_228);
                  if ((int)local_228._M_dataplus._M_p == 0) {
                    local_228._M_dataplus._M_p = (pointer)workerLoop;
                    local_228._M_string_length = 0;
                    local_1f8._M_dataplus._M_p = (pointer)this;
                    this_05 = (thread *)operator_new(8,(nothrow_t *)&std::nothrow);
                    if (this_05 != (thread *)0x0) {
                      std::thread::thread<void(mau::ProxySession::*)(),mau::ProxySession*,void>
                                (this_05,(offset_in_ProxySession_to_subr *)&local_228,
                                 (ProxySession **)&local_1f8);
                    }
                    std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                              ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                               &this->Thread,this_05);
                    MVar24 = Mau_OOM;
                    if ((this->Thread)._M_t.
                        super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
                        super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                        super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
                      uVar2 = (this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes;
                      __mutex = &(this->super_DeliveryCommonData).ReadBufferAllocator;
                      iVar16 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                      if (iVar16 != 0) {
                        std::__throw_system_error(iVar16);
                      }
                      readBuffer = pktalloc::Allocator::Allocate
                                             (&(this->super_DeliveryCommonData).ReadBufferAllocator.
                                               Allocator,uVar2 + 0x1c);
                      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                      if (readBuffer != (uint8_t *)0x0) {
                        postNextRead(this,readBuffer);
                        if (Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                            ::kAnyProtocolStr_abi_cxx11_ == '\0') {
                          iVar16 = __cxa_guard_acquire(&
                                                  Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                                  ::kAnyProtocolStr_abi_cxx11_);
                          if (iVar16 != 0) {
                            Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                            ::kAnyProtocolStr_abi_cxx11_._M_dataplus._M_p =
                                 (pointer)&Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                           ::kAnyProtocolStr_abi_cxx11_.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)
                                       &Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                        ::kAnyProtocolStr_abi_cxx11_,"");
                            __cxa_atexit(std::__cxx11::string::~string,
                                         &Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                          ::kAnyProtocolStr_abi_cxx11_,&__dso_handle);
                            __cxa_guard_release(&Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                                 ::kAnyProtocolStr_abi_cxx11_);
                          }
                        }
                        this_02 = (basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>
                                   *)(this->Resolver)._M_t.
                                     super___uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                                     .
                                     super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
                                     ._M_head_impl;
                        std::__cxx11::string::string((string *)&local_228,serverHostname,&local_1f9)
                        ;
                        local_1f8._M_dataplus._M_p = (pointer)this;
                        asio::ip::
                        basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>::
                        async_resolve<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0>
                                  (this_02,&local_228,&local_1f8,(anon_class_8_1_8991fb9c *)handler)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_228._M_dataplus._M_p != &local_228.field_2) {
                          operator_delete(local_228._M_dataplus._M_p);
                        }
                        MVar24 = Mau_Success;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  LOCK();
  (this->super_DeliveryCommonData).LastResult._M_i = MVar24;
  UNLOCK();
  if (MVar24 == Mau_Success) {
    MVar24 = Mau_Success;
  }
  else {
    if ((int)(this->super_DeliveryCommonData).Logger.ChannelMinLevel < 5) {
      local_1b8._0_8_ = (this->super_DeliveryCommonData).Logger.ChannelName;
      this_01 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(this->super_DeliveryCommonData).Logger.Prefix._M_dataplus._M_p,
                 (this->super_DeliveryCommonData).Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"ProxySession::Initialize failed: ",0x21);
      std::ostream::operator<<((ostream *)this_01,MVar24);
      this_04 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_04,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base(local_138);
    }
    Shutdown(this);
  }
  return MVar24;
}

Assistant:

MauResult ProxySession::Initialize(
    const char* serverHostname,
    uint16_t serverPort,
    const MauProxyConfig& proxyConfig,
    const MauChannelConfig& channelConfig)
{
    MauResult result = Mau_Success;

    try
    {
        ProxyConfig = proxyConfig;
        ChannelConfig.Set(channelConfig);
        ServerHostname = serverHostname;
        ServerPort = serverPort;

        // Set logger prefix
        std::ostringstream oss;
        oss << "[Port " << std::to_string(proxyConfig.UDPListenPort) << "] ";
        Logger.SetPrefix(oss.str());

        Context = MakeSharedNoThrow<asio::io_context>();
        if (!Context)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }
        Context->restart();

        // Create Asio objects
        Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Context);
        Socket = MakeUniqueNoThrow<asio::ip::udp::socket>(*Context);
        Resolver = MakeUniqueNoThrow<asio::ip::tcp::resolver>(*Context);
        if (!Socket || !Resolver || !Ticker)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        postNextTimer();

        // Initialize S2C channel
        if (!S2C.Initialize(this))
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        // Initialize C2S channel
        if (!C2S.Initialize(this))
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        // Create an IPv4/IPv6 socket based on the server address type
        const UDPAddress bindAddress(asio::ip::udp::v4(), ProxyConfig.UDPListenPort);

        asio::error_code error;
        Socket->open(bindAddress.protocol(), error);
        if (error)
        {
            result = Mau_NetworkFailed;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        Socket->bind(bindAddress, error);
        if (error)
        {
            result = Mau_PortInUse;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        if (!SetSocketOptions(
            Socket,
            "UDPSocket",
            ProxyConfig.UDPSendBufferSizeBytes,
            ProxyConfig.UDPRecvBufferSizeBytes))
        {
            result = Mau_SocketCreation;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        Thread = MakeUniqueNoThrow<std::thread>(&ProxySession::workerLoop, this);
        if (!Thread)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        uint8_t* readBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
        if (!readBuffer)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        postNextRead(readBuffer);

        // Allow any protocol
        static const std::string kAnyProtocolStr = "";

        Resolver->async_resolve(std::string(serverHostname), kAnyProtocolStr,
            [this](const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
        {
            asio::ip::address addr = firstIPv4AddressInResults(results);

            if (addr.is_unspecified())
            {
                Logger.Error("Unable to resolve server hostname: ", ServerHostname);
                LastResult = Mau_HostnameLookup;
            }
            else
            {
                const UDPAddress serverAddress(addr, ServerPort);
                ServerAddress.Set(serverAddress);
                C2S.SetDeliveryAddress(serverAddress);

                Logger.Info("Resolved server address to ", serverAddress.address().to_string(), " : ", serverAddress.port());
            }
        });
    }
    catch (...)
    {
        result = Mau_Error;
        goto OnError;
    }

OnError:
    LastResult = result;
    if (MAU_FAILED(result))
    {
        Logger.Error("ProxySession::Initialize failed: ", result);
        Shutdown();
    }

    return result;
}